

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::HessianBlocksMap::getFullSparsity
          (HessianBlocksMap *this,SparsityStructure *sparsity)

{
  size_t startRow;
  size_t startColumn;
  _Rb_tree_node_base *p_Var1;
  
  SparsityStructure::clear(sparsity);
  for (p_Var1 = (this->m_sparsity)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_sparsity)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    startRow = integrators::CollocationHessianIndex::first((CollocationHessianIndex *)(p_Var1 + 1));
    startColumn = integrators::CollocationHessianIndex::second
                            ((CollocationHessianIndex *)(p_Var1 + 1));
    SparsityStructure::addBlock
              (sparsity,startRow,startColumn,(SparsityStructure *)&p_Var1[1]._M_left);
  }
  return;
}

Assistant:

void getFullSparsity(SparsityStructure& sparsity) {
                sparsity.clear();

                for (auto& block : m_sparsity) {
                    sparsity.addBlock(block.first.first(), block.first.second(), block.second);
                }
            }